

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

void ARKodePrintMem(void *arkode_mem,FILE *outfile)

{
  undefined8 uVar1;
  uint uVar2;
  undefined8 uVar3;
  FILE *in_RSI;
  FILE *in_RDI;
  ARKodeMem ark_mem;
  FILE *arkode_mem_00;
  
  if (in_RDI == (FILE *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x511,"ARKodePrintMem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (in_RSI == (FILE *)0x0) {
      in_RSI = _stdout;
    }
    arkode_mem_00 = in_RDI;
    fprintf(in_RSI,"itol = %i\n",(ulong)*(uint *)&in_RDI->_IO_read_base);
    fprintf(in_RSI,"ritol = %i\n",(ulong)*(uint *)((long)&in_RDI->_IO_read_base + 4));
    fprintf(in_RSI,"mxhnil = %i\n",(ulong)(uint)in_RDI[3]._offset);
    fprintf(in_RSI,"mxstep = %li\n",in_RDI[3]._lock);
    fprintf(in_RSI,"lrw1 = %li\n",*(undefined8 *)(in_RDI[3]._unused2 + 0xc));
    fprintf(in_RSI,"liw1 = %li\n",*(undefined8 *)(in_RDI + 4));
    fprintf(in_RSI,"lrw = %li\n",in_RDI[4]._IO_read_ptr);
    fprintf(in_RSI,"liw = %li\n",in_RDI[4]._IO_read_end);
    fprintf(in_RSI,"user_efun = %i\n",(ulong)*(uint *)((long)&in_RDI->_IO_backup_base + 4));
    fprintf(in_RSI,"tstopset = %i\n",(ulong)*(uint *)&in_RDI[3]._IO_write_base);
    fprintf(in_RSI,"tstopinterp = %i\n",(ulong)*(uint *)((long)&in_RDI[3]._IO_write_base + 4));
    fprintf(in_RSI,"tstop = %.15g\n",in_RDI[3]._IO_write_ptr);
    fprintf(in_RSI,"VabstolMallocDone = %i\n",(ulong)*(uint *)&in_RDI[4]._IO_save_end);
    fprintf(in_RSI,"MallocDone = %i\n",(ulong)*(uint *)&in_RDI[4]._markers);
    fprintf(in_RSI,"initsetup = %i\n",(ulong)*(uint *)((long)&in_RDI[4]._markers + 4));
    fprintf(in_RSI,"init_type = %i\n",(ulong)*(uint *)&in_RDI[4]._chain);
    fprintf(in_RSI,"firststage = %i\n",(ulong)*(uint *)((long)&in_RDI[4]._chain + 4));
    fprintf(in_RSI,"uround = %.15g\n",in_RDI->_IO_read_ptr);
    fprintf(in_RSI,"reltol = %.15g\n",in_RDI->_IO_write_base);
    fprintf(in_RSI,"Sabstol = %.15g\n",in_RDI->_IO_write_ptr);
    fprintf(in_RSI,"fixedstep = %i\n",(ulong)(uint)in_RDI[3]._old_offset);
    fprintf(in_RSI,"tolsf = %.15g\n",in_RDI[4]._IO_buf_base);
    fprintf(in_RSI,"call_fullrhs = %i\n",(ulong)(uint)in_RDI[4]._flags2);
    fprintf(in_RSI,"do_adjoint = %i\n",(ulong)*(uint *)&in_RDI[4]._freeres_buf);
    fprintf(in_RSI,"nhnil = %i\n",(ulong)*(uint *)&in_RDI[3]._freeres_buf);
    fprintf(in_RSI,"nst_attempts = %li\n",in_RDI[3]._wide_data);
    fprintf(in_RSI,"nst = %li\n",in_RDI[3]._freeres_list);
    fprintf(in_RSI,"ncfn = %li\n",in_RDI[3].__pad5);
    uVar3._0_4_ = in_RDI[3]._mode;
    uVar3._4_1_ = in_RDI[3]._unused2[0];
    uVar3._5_1_ = in_RDI[3]._unused2[1];
    uVar3._6_1_ = in_RDI[3]._unused2[2];
    uVar3._7_1_ = in_RDI[3]._unused2[3];
    fprintf(in_RSI,"netf = %li\n",uVar3);
    fprintf(in_RSI,"hin = %.15g\n",in_RDI[3]._IO_write_end);
    fprintf(in_RSI,"h = %.15g\n",in_RDI[3]._IO_buf_base);
    fprintf(in_RSI,"hprime = %.15g\n",in_RDI[3]._IO_backup_base);
    fprintf(in_RSI,"next_h = %.15g\n",in_RDI[3]._IO_save_end);
    fprintf(in_RSI,"eta = %.15g\n",in_RDI[3]._markers);
    fprintf(in_RSI,"tcur = %.15g\n",in_RDI[3]._chain);
    uVar1._0_4_ = in_RDI[3]._fileno;
    uVar1._4_4_ = in_RDI[3]._flags2;
    fprintf(in_RSI,"tretlast = %.15g\n",uVar1);
    fprintf(in_RSI,"hmin = %.15g\n",in_RDI[3]._IO_buf_end);
    fprintf(in_RSI,"hmax_inv = %.15g\n",in_RDI[3]._IO_save_base);
    fprintf(in_RSI,"h0u = %.15g\n",in_RDI[4]._IO_read_base);
    fprintf(in_RSI,"tn = %.15g\n",in_RDI[4]._IO_write_base);
    fprintf(in_RSI,"hold = %.15g\n",in_RDI[4]._IO_write_end);
    fprintf(in_RSI,"maxnef = %i\n",(ulong)*(uint *)&in_RDI[3]._codecvt);
    fprintf(in_RSI,"maxncf = %i\n",(ulong)*(uint *)((long)&in_RDI[3]._codecvt + 4));
    fprintf(in_RSI,"timestep adaptivity structure:\n");
    arkPrintAdaptMem((ARKodeHAdaptMem)in_RSI,in_RDI);
    uVar2._0_2_ = in_RDI->_cur_column;
    uVar2._2_1_ = in_RDI->_vtable_offset;
    uVar2._3_1_ = in_RDI->_shortbuf[0];
    fprintf(in_RSI,"constraintsSet = %i\n",(ulong)uVar2);
    fprintf(in_RSI,"maxconstrfails = %i\n",(ulong)*(uint *)((long)&in_RDI[3]._offset + 4));
    if (in_RDI[4]._old_offset != 0) {
      arkPrintRootMem(arkode_mem_00,(FILE *)in_RSI);
    }
    if (in_RDI[3]._IO_read_end == (char *)0x0) {
      fprintf(in_RSI,"interpolation = NULL\n");
    }
    else {
      arkInterpPrintMem((ARKInterp)in_RSI,in_RDI);
    }
    if (*(long *)(in_RDI + 1) != 0) {
      (**(code **)(in_RDI + 1))(in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void ARKodePrintMem(void* arkode_mem, FILE* outfile)
{
  ARKodeMem ark_mem;

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* if outfile==NULL, set it to stdout */
  if (outfile == NULL) { outfile = stdout; }

  /* output general values */
  fprintf(outfile, "itol = %i\n", ark_mem->itol);
  fprintf(outfile, "ritol = %i\n", ark_mem->ritol);
  fprintf(outfile, "mxhnil = %i\n", ark_mem->mxhnil);
  fprintf(outfile, "mxstep = %li\n", ark_mem->mxstep);
  fprintf(outfile, "lrw1 = %li\n", (long int)ark_mem->lrw1);
  fprintf(outfile, "liw1 = %li\n", (long int)ark_mem->liw1);
  fprintf(outfile, "lrw = %li\n", (long int)ark_mem->lrw);
  fprintf(outfile, "liw = %li\n", (long int)ark_mem->liw);
  fprintf(outfile, "user_efun = %i\n", ark_mem->user_efun);
  fprintf(outfile, "tstopset = %i\n", ark_mem->tstopset);
  fprintf(outfile, "tstopinterp = %i\n", ark_mem->tstopinterp);
  fprintf(outfile, "tstop = " SUN_FORMAT_G "\n", ark_mem->tstop);
  fprintf(outfile, "VabstolMallocDone = %i\n", ark_mem->VabstolMallocDone);
  fprintf(outfile, "MallocDone = %i\n", ark_mem->MallocDone);
  fprintf(outfile, "initsetup = %i\n", ark_mem->initsetup);
  fprintf(outfile, "init_type = %i\n", ark_mem->init_type);
  fprintf(outfile, "firststage = %i\n", ark_mem->firststage);
  fprintf(outfile, "uround = " SUN_FORMAT_G "\n", ark_mem->uround);
  fprintf(outfile, "reltol = " SUN_FORMAT_G "\n", ark_mem->reltol);
  fprintf(outfile, "Sabstol = " SUN_FORMAT_G "\n", ark_mem->Sabstol);
  fprintf(outfile, "fixedstep = %i\n", ark_mem->fixedstep);
  fprintf(outfile, "tolsf = " SUN_FORMAT_G "\n", ark_mem->tolsf);
  fprintf(outfile, "call_fullrhs = %i\n", ark_mem->call_fullrhs);
  fprintf(outfile, "do_adjoint = %i\n", ark_mem->do_adjoint);

  /* output counters */
  fprintf(outfile, "nhnil = %i\n", ark_mem->nhnil);
  fprintf(outfile, "nst_attempts = %li\n", ark_mem->nst_attempts);
  fprintf(outfile, "nst = %li\n", ark_mem->nst);
  fprintf(outfile, "ncfn = %li\n", ark_mem->ncfn);
  fprintf(outfile, "netf = %li\n", ark_mem->netf);

  /* output time-stepping values */
  fprintf(outfile, "hin = " SUN_FORMAT_G "\n", ark_mem->hin);
  fprintf(outfile, "h = " SUN_FORMAT_G "\n", ark_mem->h);
  fprintf(outfile, "hprime = " SUN_FORMAT_G "\n", ark_mem->hprime);
  fprintf(outfile, "next_h = " SUN_FORMAT_G "\n", ark_mem->next_h);
  fprintf(outfile, "eta = " SUN_FORMAT_G "\n", ark_mem->eta);
  fprintf(outfile, "tcur = " SUN_FORMAT_G "\n", ark_mem->tcur);
  fprintf(outfile, "tretlast = " SUN_FORMAT_G "\n", ark_mem->tretlast);
  fprintf(outfile, "hmin = " SUN_FORMAT_G "\n", ark_mem->hmin);
  fprintf(outfile, "hmax_inv = " SUN_FORMAT_G "\n", ark_mem->hmax_inv);
  fprintf(outfile, "h0u = " SUN_FORMAT_G "\n", ark_mem->h0u);
  fprintf(outfile, "tn = " SUN_FORMAT_G "\n", ark_mem->tn);
  fprintf(outfile, "hold = " SUN_FORMAT_G "\n", ark_mem->hold);
  fprintf(outfile, "maxnef = %i\n", ark_mem->maxnef);
  fprintf(outfile, "maxncf = %i\n", ark_mem->maxncf);

  /* output time-stepping adaptivity structure */
  fprintf(outfile, "timestep adaptivity structure:\n");
  arkPrintAdaptMem(ark_mem->hadapt_mem, outfile);

  /* output inequality constraints quantities */
  fprintf(outfile, "constraintsSet = %i\n", ark_mem->constraintsSet);
  fprintf(outfile, "maxconstrfails = %i\n", ark_mem->maxconstrfails);

  /* output root-finding quantities */
  if (ark_mem->root_mem != NULL)
  {
    (void)arkPrintRootMem((void*)ark_mem, outfile);
  }

  /* output interpolation quantities */
  if (ark_mem->interp) { arkInterpPrintMem(ark_mem->interp, outfile); }
  else { fprintf(outfile, "interpolation = NULL\n"); }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "Vapbsol:\n");
  N_VPrintFile(ark_mem->Vabstol, outfile);
  fprintf(outfile, "ewt:\n");
  N_VPrintFile(ark_mem->ewt, outfile);
  if (!ark_mem->rwt_is_ewt)
  {
    fprintf(outfile, "rwt:\n");
    N_VPrintFile(ark_mem->rwt, outfile);
  }
  fprintf(outfile, "ycur:\n");
  N_VPrintFile(ark_mem->ycur, outfile);
  fprintf(outfile, "yn:\n");
  N_VPrintFile(ark_mem->yn, outfile);
  fprintf(outfile, "fn:\n");
  if (ark_mem->fn) { N_VPrintFile(ark_mem->fn, outfile); }
  fprintf(outfile, "tempv1:\n");
  N_VPrintFile(ark_mem->tempv1, outfile);
  fprintf(outfile, "tempv2:\n");
  N_VPrintFile(ark_mem->tempv2, outfile);
  fprintf(outfile, "tempv3:\n");
  N_VPrintFile(ark_mem->tempv3, outfile);
  fprintf(outfile, "tempv4:\n");
  N_VPrintFile(ark_mem->tempv4, outfile);
  fprintf(outfile, "tempv5:\n");
  N_VPrintFile(ark_mem->tempv5, outfile);
  fprintf(outfile, "constraints:\n");
  N_VPrintFile(ark_mem->constraints, outfile);
#endif

  /* Call stepper PrintMem function (if provided) */
  if (ark_mem->step_printmem) { ark_mem->step_printmem(ark_mem, outfile); }
}